

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsStorage.cpp
# Opt level: O0

void __thiscall
vkt::sparse::SparseShaderIntrinsicsInstanceStorage::recordCommands
          (SparseShaderIntrinsicsInstanceStorage *this,VkCommandBuffer commandBuffer,
          VkImageCreateInfo *imageSparseInfo,VkImage imageSparse,VkImage imageTexels,
          VkImage imageResidency)

{
  VkPipelineLayout pipelineLayout_00;
  VkDescriptorPool descriptorPool;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  VkImageSubresourceRange subresourceRange_03;
  VkImageSubresourceRange subresourceRange_04;
  VkImageSubresourceRange subresourceRange_05;
  VkImageSubresourceRange subresourceRange_06;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)16>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  bool bVar1;
  VkFormat VVar2;
  VkDescriptorType VVar3;
  VkImageViewType VVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  InstanceInterface *instance_00;
  DeviceInterface *vk;
  VkPhysicalDevice physicalDevice_00;
  NotSupportedError *pNVar11;
  TestError *this_00;
  VkDevice pVVar12;
  Handle<(vk::HandleType)19> *pHVar13;
  ProgramCollection<vk::ProgramBinary> *this_01;
  ProgramBinary *binary;
  Handle<(vk::HandleType)16> *pHVar14;
  Handle<(vk::HandleType)14> *pHVar15;
  reference pvVar16;
  RefBase<vk::Handle<(vk::HandleType)18>_> *this_02;
  Handle<(vk::HandleType)18> *pHVar17;
  Handle<(vk::HandleType)21> *pHVar18;
  reference pvVar19;
  RefBase<vk::Handle<(vk::HandleType)22>_> *this_03;
  Handle<(vk::HandleType)22> *pHVar20;
  reference pvVar21;
  RefBase<vk::Handle<(vk::HandleType)13>_> *pRVar22;
  Handle<(vk::HandleType)13> *pHVar23;
  VkImageMemoryBarrier *local_b20;
  VkImageMemoryBarrier *local_9e8;
  VkImageMemoryBarrier local_950;
  undefined8 local_908;
  VkImageSubresourceRange VStack_900;
  deUint64 local_8e8;
  undefined1 local_8e0 [40];
  VkImage VStack_8b8;
  deUint64 local_8b0;
  undefined1 auStack_8a8 [24];
  VkImageMemoryBarrier imageOutputTransferSrcBarriers [2];
  UVec3 maxWorkGroupCount;
  deUint32 zWorkGroupCount;
  deUint32 yWorkGroupCount;
  deUint32 xWorkGroupCount;
  Location local_7e8;
  VkDescriptorSet local_7e0;
  Location local_7d8;
  VkDescriptorSet local_7d0;
  Location local_7c8;
  VkDescriptorSet local_7c0;
  undefined1 local_7b8 [8];
  DescriptorSetUpdateBuilder descriptorUpdateBuilder;
  VkSampler local_768;
  undefined1 local_760 [8];
  VkDescriptorImageInfo imageResidencyDescInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_720;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_700;
  deUint64 local_6f0;
  VkSampler local_6e8;
  undefined1 local_6e0 [8];
  VkDescriptorImageInfo imageTexelsDescInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_6a0;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_680;
  deUint64 local_670;
  VkSampler local_668;
  undefined1 local_660 [8];
  VkDescriptorImageInfo imageSparseDescInfo;
  Move<vk::Handle<(vk::HandleType)13>_> local_628;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> local_608;
  undefined1 auStack_5f4 [8];
  VkImageSubresourceRange mipLevelRange;
  VkDescriptorSet descriptorSet;
  Move<vk::Handle<(vk::HandleType)22>_> local_5c8;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> local_5a8;
  deUint64 local_598;
  deUint64 local_590;
  VkPipeline computePipeline;
  Move<vk::Handle<(vk::HandleType)18>_> local_578;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> local_558;
  undefined1 local_548 [8];
  VkSpecializationInfo specializationInfo;
  UVec3 specializationData [2];
  undefined1 local_508 [8];
  UVec3 workGroupSize;
  UVec3 gridSize;
  deUint32 mipLevelNdx;
  Move<vk::Handle<(vk::HandleType)14>_> local_4c8;
  RefData<vk::Handle<(vk::HandleType)14>_> local_4a8;
  undefined1 local_488 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  VkSpecializationMapEntry specializationMapEntries [6];
  VkImageMemoryBarrier local_3e0;
  undefined8 local_398;
  VkImageSubresourceRange VStack_390;
  deUint64 local_378;
  undefined1 local_370 [40];
  VkImage VStack_348;
  deUint64 local_340;
  undefined1 auStack_338 [24];
  VkImageSubresourceRange VStack_320;
  deUint64 local_308;
  undefined1 local_300 [40];
  VkImage VStack_2d8;
  deUint64 local_2d0;
  undefined1 auStack_2c8 [24];
  VkImageMemoryBarrier imageShaderAccessBarriers [3];
  undefined4 uStack_1d8;
  VkImageSubresourceRange fullImageSubresourceRange;
  RefData<vk::Handle<(vk::HandleType)21>_> local_1a8;
  undefined1 local_188 [8];
  DescriptorPoolBuilder descriptorPoolBuilder;
  Move<vk::Handle<(vk::HandleType)16>_> local_168;
  RefData<vk::Handle<(vk::HandleType)16>_> local_148;
  undefined1 local_128 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  RefData<vk::Handle<(vk::HandleType)19>_> local_e8;
  undefined1 local_c8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  DescriptorSetLayoutBuilder descriptorLayerBuilder;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *deviceInterface;
  InstanceInterface *instance;
  VkImageCreateInfo *imageSparseInfo_local;
  VkCommandBuffer commandBuffer_local;
  SparseShaderIntrinsicsInstanceStorage *this_local;
  VkImage imageResidency_local;
  VkImage imageTexels_local;
  VkImage imageSparse_local;
  
  instance_00 = Context::getInstanceInterface
                          ((this->super_SparseShaderIntrinsicsInstanceBase).
                           super_SparseResourcesBaseInstance.super_TestInstance.m_context);
  vk = SparseResourcesBaseInstance::getDeviceInterface((SparseResourcesBaseInstance *)this);
  physicalDevice_00 =
       Context::getPhysicalDevice
                 ((this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance
                  .super_TestInstance.m_context);
  bVar1 = checkImageFormatFeatureSupport(instance_00,physicalDevice_00,imageSparseInfo->format,2);
  if (!bVar1) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Device does not support image format for storage image",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
               ,0x163);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  VVar2 = ::vk::mapTextureFormat
                    (&(this->super_SparseShaderIntrinsicsInstanceBase).m_residencyFormat);
  bVar1 = checkImageFormatFeatureSupport(instance_00,physicalDevice_00,VVar2,2);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Device does not support VK_FORMAT_R32_UINT format for storage image",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
               ,0x167);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::resize(&(this->super_SparseShaderIntrinsicsInstanceBase).pipelines,
           (ulong)imageSparseInfo->mipLevels);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::resize(&(this->super_SparseShaderIntrinsicsInstanceBase).descriptorSets,
           (ulong)imageSparseInfo->mipLevels);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::resize(&(this->super_SparseShaderIntrinsicsInstanceBase).imageSparseViews,
           (ulong)imageSparseInfo->mipLevels);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::resize(&(this->super_SparseShaderIntrinsicsInstanceBase).imageTexelsViews,
           (ulong)imageSparseInfo->mipLevels);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::resize(&(this->super_SparseShaderIntrinsicsInstanceBase).imageResidencyViews,
           (ulong)imageSparseInfo->mipLevels);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator);
  VVar3 = (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
            super_TestInstance._vptr_TestInstance[7])();
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator,VVar3,0x20);
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::addSingleBinding
            ((DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator,
             (DescriptorSetLayoutBuilder *)
             &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
              m_allocator,vk,pVVar12,0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_e8,
             (Move *)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                      m_allocator);
  data.deleter.m_deviceIface._0_4_ = (int)local_e8.deleter.m_deviceIface;
  data.object.m_internal = local_e8.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_e8.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_e8.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_e8.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_e8.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_e8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_c8,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_c8);
  descriptorPoolBuilder.m_counts.
  super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pHVar13->m_internal;
  makePipelineLayout(&local_168,vk,pVVar12,
                     (VkDescriptorSetLayout)
                     descriptorPoolBuilder.m_counts.
                     super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_148,(Move *)&local_168);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_148.deleter.m_deviceIface;
  data_00.object.m_internal = local_148.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_148.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_148.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_148.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_148.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_148.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_128,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_168);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)local_188);
  VVar3 = (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
            super_TestInstance._vptr_TestInstance[7])();
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_188,VVar3,imageSparseInfo->mipLevels);
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_188,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
             imageSparseInfo->mipLevels);
  ::vk::DescriptorPoolBuilder::addType
            ((DescriptorPoolBuilder *)local_188,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
             imageSparseInfo->mipLevels);
  pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&fullImageSubresourceRange.baseArrayLayer,
             (DescriptorPoolBuilder *)local_188,vk,pVVar12,1,imageSparseInfo->mipLevels);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1a8,(Move *)&fullImageSubresourceRange.baseArrayLayer);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1a8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1a8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1a8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_1a8.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_1a8.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_1a8.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_1a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&(this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&fullImageSubresourceRange.baseArrayLayer);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&imageShaderAccessBarriers[2].field_0x44,1,0,
             imageSparseInfo->mipLevels,0,imageSparseInfo->arrayLayers);
  local_9e8 = (VkImageMemoryBarrier *)(auStack_2c8 + 0x10);
  do {
    ::vk::VkImageMemoryBarrier::VkImageMemoryBarrier(local_9e8);
    local_9e8 = local_9e8 + 1;
  } while (local_9e8 !=
           (VkImageMemoryBarrier *)&imageShaderAccessBarriers[2].subresourceRange.layerCount);
  VStack_320.levelCount = fullImageSubresourceRange.levelCount;
  auStack_338._16_8_ = stack0xfffffffffffffe24;
  VStack_320.aspectMask = fullImageSubresourceRange.aspectMask;
  VStack_320.baseMipLevel = fullImageSubresourceRange.baseMipLevel;
  subresourceRange.levelCount = fullImageSubresourceRange.aspectMask;
  subresourceRange.aspectMask = imageShaderAccessBarriers[2]._68_4_;
  subresourceRange.baseMipLevel = uStack_1d8;
  subresourceRange.baseArrayLayer = fullImageSubresourceRange.baseMipLevel;
  subresourceRange.layerCount = fullImageSubresourceRange.levelCount;
  local_308 = imageSparse.m_internal;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_300,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,imageSparse,subresourceRange);
  imageShaderAccessBarriers[0].subresourceRange.levelCount = auStack_2c8._8_4_;
  imageShaderAccessBarriers[0].image.m_internal = local_2d0;
  imageShaderAccessBarriers[0].subresourceRange.aspectMask = auStack_2c8._0_4_;
  imageShaderAccessBarriers[0].subresourceRange.baseMipLevel = auStack_2c8._4_4_;
  imageShaderAccessBarriers[0].oldLayout = local_300._32_4_;
  imageShaderAccessBarriers[0].newLayout = local_300._36_4_;
  imageShaderAccessBarriers[0].srcQueueFamilyIndex = (undefined4)VStack_2d8.m_internal;
  imageShaderAccessBarriers[0].dstQueueFamilyIndex = VStack_2d8.m_internal._4_4_;
  imageShaderAccessBarriers[0].pNext = (void *)local_300._16_8_;
  imageShaderAccessBarriers[0].srcAccessMask = local_300._24_4_;
  imageShaderAccessBarriers[0].dstAccessMask = local_300._28_4_;
  auStack_2c8._16_8_ = local_300._0_8_;
  imageShaderAccessBarriers[0]._0_8_ = local_300._8_8_;
  VStack_390.levelCount = fullImageSubresourceRange.levelCount;
  local_398 = stack0xfffffffffffffe24;
  VStack_390.aspectMask = fullImageSubresourceRange.aspectMask;
  VStack_390.baseMipLevel = fullImageSubresourceRange.baseMipLevel;
  subresourceRange_00.levelCount = fullImageSubresourceRange.aspectMask;
  subresourceRange_00.aspectMask = imageShaderAccessBarriers[2]._68_4_;
  subresourceRange_00.baseMipLevel = uStack_1d8;
  subresourceRange_00.baseArrayLayer = fullImageSubresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = fullImageSubresourceRange.levelCount;
  local_378 = imageTexels.m_internal;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_370,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_GENERAL,imageTexels,subresourceRange_00);
  imageShaderAccessBarriers[1].subresourceRange.levelCount = auStack_338._8_4_;
  imageShaderAccessBarriers[1].image.m_internal = local_340;
  imageShaderAccessBarriers[1].subresourceRange.aspectMask = auStack_338._0_4_;
  imageShaderAccessBarriers[1].subresourceRange.baseMipLevel = auStack_338._4_4_;
  imageShaderAccessBarriers[1].oldLayout = local_370._32_4_;
  imageShaderAccessBarriers[1].newLayout = local_370._36_4_;
  imageShaderAccessBarriers[1].srcQueueFamilyIndex = (undefined4)VStack_348.m_internal;
  imageShaderAccessBarriers[1].dstQueueFamilyIndex = VStack_348.m_internal._4_4_;
  imageShaderAccessBarriers[1].pNext = (void *)local_370._16_8_;
  imageShaderAccessBarriers[1].srcAccessMask = local_370._24_4_;
  imageShaderAccessBarriers[1].dstAccessMask = local_370._28_4_;
  imageShaderAccessBarriers[0]._64_8_ = local_370._0_8_;
  imageShaderAccessBarriers[1]._0_8_ = local_370._8_8_;
  subresourceRange_01.levelCount = fullImageSubresourceRange.aspectMask;
  subresourceRange_01.aspectMask = imageShaderAccessBarriers[2]._68_4_;
  subresourceRange_01.baseMipLevel = uStack_1d8;
  subresourceRange_01.baseArrayLayer = fullImageSubresourceRange.baseMipLevel;
  subresourceRange_01.layerCount = fullImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            (&local_3e0,0,0x40,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,imageResidency,
             subresourceRange_01);
  imageShaderAccessBarriers[2].subresourceRange.levelCount = local_3e0.subresourceRange.layerCount;
  imageShaderAccessBarriers[2].image.m_internal._0_4_ = local_3e0.subresourceRange.aspectMask;
  imageShaderAccessBarriers[2].image.m_internal._4_4_ = local_3e0.subresourceRange.baseMipLevel;
  imageShaderAccessBarriers[2].subresourceRange.aspectMask = local_3e0.subresourceRange.levelCount;
  imageShaderAccessBarriers[2].subresourceRange.baseMipLevel =
       local_3e0.subresourceRange.baseArrayLayer;
  imageShaderAccessBarriers[2].oldLayout = local_3e0.srcQueueFamilyIndex;
  imageShaderAccessBarriers[2].newLayout = local_3e0.dstQueueFamilyIndex;
  imageShaderAccessBarriers[2].srcQueueFamilyIndex = (deUint32)local_3e0.image.m_internal;
  imageShaderAccessBarriers[2].dstQueueFamilyIndex = local_3e0.image.m_internal._4_4_;
  imageShaderAccessBarriers[2].pNext._0_4_ = local_3e0.srcAccessMask;
  imageShaderAccessBarriers[2].pNext._4_4_ = local_3e0.dstAccessMask;
  imageShaderAccessBarriers[2].srcAccessMask = local_3e0.oldLayout;
  imageShaderAccessBarriers[2].dstAccessMask = local_3e0.newLayout;
  imageShaderAccessBarriers[1].subresourceRange.layerCount = local_3e0.sType;
  imageShaderAccessBarriers[1]._68_4_ = local_3e0._4_4_;
  imageShaderAccessBarriers[2].sType = (VkStructureType)local_3e0.pNext;
  imageShaderAccessBarriers[2]._4_4_ = local_3e0.pNext._4_4_;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,commandBuffer,0x1000,0x800,0,0,0,0,0,3,auStack_2c8 + 0x10);
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x1;
  pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
  this_01 = Context::getBinaryCollection
                      ((this->super_SparseShaderIntrinsicsInstanceBase).
                       super_SparseResourcesBaseInstance.super_TestInstance.m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mipLevelNdx,"compute",(allocator<char> *)((long)gridSize.m_data + 0xb));
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_01,(string *)&mipLevelNdx);
  ::vk::createShaderModule(&local_4c8,vk,pVVar12,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4a8,(Move *)&local_4c8);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_4a8.deleter.m_deviceIface;
  data_02.object.m_internal = local_4a8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4a8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_4a8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_4a8.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_4a8.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_4a8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_488,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_4c8);
  std::__cxx11::string::~string((string *)&mipLevelNdx);
  std::allocator<char>::~allocator((allocator<char> *)((long)gridSize.m_data + 0xb));
  gridSize.m_data[1] = 0;
  while( true ) {
    if (imageSparseInfo->mipLevels <= gridSize.m_data[1]) {
      local_b20 = (VkImageMemoryBarrier *)(auStack_8a8 + 0x10);
      do {
        ::vk::VkImageMemoryBarrier::VkImageMemoryBarrier(local_b20);
        local_b20 = local_b20 + 1;
      } while (local_b20 !=
               (VkImageMemoryBarrier *)
               &imageOutputTransferSrcBarriers[1].subresourceRange.layerCount);
      VStack_900.levelCount = fullImageSubresourceRange.levelCount;
      local_908 = stack0xfffffffffffffe24;
      VStack_900.aspectMask = fullImageSubresourceRange.aspectMask;
      VStack_900.baseMipLevel = fullImageSubresourceRange.baseMipLevel;
      subresourceRange_05.levelCount = fullImageSubresourceRange.aspectMask;
      subresourceRange_05.aspectMask = imageShaderAccessBarriers[2]._68_4_;
      subresourceRange_05.baseMipLevel = uStack_1d8;
      subresourceRange_05.baseArrayLayer = fullImageSubresourceRange.baseMipLevel;
      subresourceRange_05.layerCount = fullImageSubresourceRange.levelCount;
      local_8e8 = imageTexels.m_internal;
      makeImageMemoryBarrier
                ((VkImageMemoryBarrier *)local_8e0,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
                 VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,imageTexels,subresourceRange_05);
      imageOutputTransferSrcBarriers[0].subresourceRange.levelCount = auStack_8a8._8_4_;
      imageOutputTransferSrcBarriers[0].image.m_internal = local_8b0;
      imageOutputTransferSrcBarriers[0].subresourceRange.aspectMask = auStack_8a8._0_4_;
      imageOutputTransferSrcBarriers[0].subresourceRange.baseMipLevel = auStack_8a8._4_4_;
      imageOutputTransferSrcBarriers[0].oldLayout = local_8e0._32_4_;
      imageOutputTransferSrcBarriers[0].newLayout = local_8e0._36_4_;
      imageOutputTransferSrcBarriers[0].srcQueueFamilyIndex = (undefined4)VStack_8b8.m_internal;
      imageOutputTransferSrcBarriers[0].dstQueueFamilyIndex = VStack_8b8.m_internal._4_4_;
      imageOutputTransferSrcBarriers[0].pNext = (void *)local_8e0._16_8_;
      imageOutputTransferSrcBarriers[0].srcAccessMask = local_8e0._24_4_;
      imageOutputTransferSrcBarriers[0].dstAccessMask = local_8e0._28_4_;
      auStack_8a8._16_8_ = local_8e0._0_8_;
      imageOutputTransferSrcBarriers[0]._0_8_ = local_8e0._8_8_;
      subresourceRange_06.levelCount = fullImageSubresourceRange.aspectMask;
      subresourceRange_06.aspectMask = imageShaderAccessBarriers[2]._68_4_;
      subresourceRange_06.baseMipLevel = uStack_1d8;
      subresourceRange_06.baseArrayLayer = fullImageSubresourceRange.baseMipLevel;
      subresourceRange_06.layerCount = fullImageSubresourceRange.levelCount;
      makeImageMemoryBarrier
                (&local_950,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                 imageResidency,subresourceRange_06);
      imageOutputTransferSrcBarriers[1].subresourceRange.levelCount =
           local_950.subresourceRange.layerCount;
      imageOutputTransferSrcBarriers[1].image.m_internal._0_4_ =
           local_950.subresourceRange.aspectMask;
      imageOutputTransferSrcBarriers[1].image.m_internal._4_4_ =
           local_950.subresourceRange.baseMipLevel;
      imageOutputTransferSrcBarriers[1].subresourceRange.aspectMask =
           local_950.subresourceRange.levelCount;
      imageOutputTransferSrcBarriers[1].subresourceRange.baseMipLevel =
           local_950.subresourceRange.baseArrayLayer;
      imageOutputTransferSrcBarriers[1].oldLayout = local_950.srcQueueFamilyIndex;
      imageOutputTransferSrcBarriers[1].newLayout = local_950.dstQueueFamilyIndex;
      imageOutputTransferSrcBarriers[1].srcQueueFamilyIndex = (deUint32)local_950.image.m_internal;
      imageOutputTransferSrcBarriers[1].dstQueueFamilyIndex = local_950.image.m_internal._4_4_;
      imageOutputTransferSrcBarriers[1].pNext._0_4_ = local_950.srcAccessMask;
      imageOutputTransferSrcBarriers[1].pNext._4_4_ = local_950.dstAccessMask;
      imageOutputTransferSrcBarriers[1].srcAccessMask = local_950.oldLayout;
      imageOutputTransferSrcBarriers[1].dstAccessMask = local_950.newLayout;
      imageOutputTransferSrcBarriers[0].subresourceRange.layerCount = local_950.sType;
      imageOutputTransferSrcBarriers[0]._68_4_ = local_950._4_4_;
      imageOutputTransferSrcBarriers[1].sType = (VkStructureType)local_950.pNext;
      imageOutputTransferSrcBarriers[1]._4_4_ = local_950.pNext._4_4_;
      (*vk->_vptr_DeviceInterface[0x6d])
                (vk,commandBuffer,0x800,0x1000,0,0,0,0,0,2,auStack_8a8 + 0x10);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_488);
      ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder((DescriptorPoolBuilder *)local_188);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_128);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_c8);
      ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
                ((DescriptorSetLayoutBuilder *)
                 &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                  m_allocator);
      return;
    }
    getShaderGridSize((sparse *)(workGroupSize.m_data + 1),
                      (this->super_SparseShaderIntrinsicsInstanceBase).m_imageType,
                      &(this->super_SparseShaderIntrinsicsInstanceBase).m_imageSize,
                      gridSize.m_data[1]);
    computeWorkGroupSize((sparse *)local_508,(UVec3 *)(workGroupSize.m_data + 1));
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)&specializationInfo.pData,
               (Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)(specializationData[0].m_data + 1),
               (Vector<unsigned_int,_3> *)local_508);
    local_548._0_4_ = 6;
    specializationInfo._0_8_ =
         &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
    specializationInfo.pMapEntries = (VkSpecializationMapEntry *)0x18;
    specializationInfo.dataSize = (deUintptr)&specializationInfo.pData;
    pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_128);
    pipelineLayout_00.m_internal = pHVar14->m_internal;
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_488);
    computePipeline.m_internal = pHVar15->m_internal;
    makeComputePipeline(&local_578,vk,pVVar12,pipelineLayout_00,
                        (VkShaderModule)computePipeline.m_internal,(VkSpecializationInfo *)local_548
                       );
    makeVkSharedPtr<vk::Handle<(vk::HandleType)18>>((sparse *)&local_558,&local_578);
    pvVar16 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).pipelines,
                           (ulong)gridSize.m_data[1]);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator=
              (pvVar16,&local_558);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr(&local_558);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_578);
    pvVar16 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).pipelines,
                           (ulong)gridSize.m_data[1]);
    this_02 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator*
                         (pvVar16)->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*(this_02);
    local_598 = pHVar17->m_internal;
    local_590 = local_598;
    (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer,1,local_598);
    pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                        (&(this->super_SparseShaderIntrinsicsInstanceBase).descriptorPool.
                          super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    descriptorPool.m_internal = pHVar18->m_internal;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_c8);
    makeDescriptorSet(&local_5c8,vk,pVVar12,descriptorPool,
                      (VkDescriptorSetLayout)pHVar13->m_internal);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>((sparse *)&local_5a8,&local_5c8);
    pvVar19 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).descriptorSets,
                           (ulong)gridSize.m_data[1]);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              (pvVar19,&local_5a8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr(&local_5a8);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_5c8);
    pvVar19 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).descriptorSets,
                           (ulong)gridSize.m_data[1]);
    this_03 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator*
                         (pvVar19)->super_RefBase<vk::Handle<(vk::HandleType)22>_>;
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*(this_03);
    mipLevelRange._12_8_ = pHVar20->m_internal;
    ::vk::makeImageSubresourceRange
              ((VkImageSubresourceRange *)auStack_5f4,1,gridSize.m_data[1],1,0,
               imageSparseInfo->arrayLayers);
    pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    VVar4 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
    imageSparseDescInfo._16_8_ = auStack_5f4;
    subresourceRange_02.levelCount = mipLevelRange.aspectMask;
    subresourceRange_02.aspectMask = auStack_5f4._0_4_;
    subresourceRange_02.baseMipLevel = auStack_5f4._4_4_;
    subresourceRange_02.baseArrayLayer = mipLevelRange.baseMipLevel;
    subresourceRange_02.layerCount = mipLevelRange.levelCount;
    makeImageView(&local_628,vk,pVVar12,imageSparse,VVar4,imageSparseInfo->format,
                  subresourceRange_02);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((sparse *)&local_608,&local_628);
    pvVar21 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).imageSparseViews,
                           (ulong)gridSize.m_data[1]);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              (pvVar21,&local_608);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_608);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_628);
    ::vk::Handle<(vk::HandleType)20>::Handle(&local_668,0);
    pvVar21 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).imageSparseViews,
                           (ulong)gridSize.m_data[1]);
    pRVar22 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (pvVar21)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar22);
    local_670 = pHVar23->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_660,local_668,(VkImageView)local_670,
               VK_IMAGE_LAYOUT_GENERAL);
    pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    VVar4 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
    imageTexelsDescInfo._16_8_ = auStack_5f4;
    subresourceRange_03.levelCount = mipLevelRange.aspectMask;
    subresourceRange_03.aspectMask = auStack_5f4._0_4_;
    subresourceRange_03.baseMipLevel = auStack_5f4._4_4_;
    subresourceRange_03.baseArrayLayer = mipLevelRange.baseMipLevel;
    subresourceRange_03.layerCount = mipLevelRange.levelCount;
    makeImageView(&local_6a0,vk,pVVar12,imageTexels,VVar4,imageSparseInfo->format,
                  subresourceRange_03);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((sparse *)&local_680,&local_6a0);
    pvVar21 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).imageTexelsViews,
                           (ulong)gridSize.m_data[1]);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              (pvVar21,&local_680);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_680);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_6a0);
    ::vk::Handle<(vk::HandleType)20>::Handle(&local_6e8,0);
    pvVar21 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).imageTexelsViews,
                           (ulong)gridSize.m_data[1]);
    pRVar22 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (pvVar21)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar22);
    local_6f0 = pHVar23->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_6e0,local_6e8,(VkImageView)local_6f0,
               VK_IMAGE_LAYOUT_GENERAL);
    pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    VVar4 = mapImageViewType((this->super_SparseShaderIntrinsicsInstanceBase).m_imageType);
    VVar2 = ::vk::mapTextureFormat
                      (&(this->super_SparseShaderIntrinsicsInstanceBase).m_residencyFormat);
    imageResidencyDescInfo._16_8_ = auStack_5f4;
    subresourceRange_04.levelCount = mipLevelRange.aspectMask;
    subresourceRange_04.aspectMask = auStack_5f4._0_4_;
    subresourceRange_04.baseMipLevel = auStack_5f4._4_4_;
    subresourceRange_04.baseArrayLayer = mipLevelRange.baseMipLevel;
    subresourceRange_04.layerCount = mipLevelRange.levelCount;
    makeImageView(&local_720,vk,pVVar12,imageResidency,VVar4,VVar2,subresourceRange_04);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>((sparse *)&local_700,&local_720);
    pvVar21 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).imageResidencyViews,
                           (ulong)gridSize.m_data[1]);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              (pvVar21,&local_700);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::~SharedPtr(&local_700);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_720);
    ::vk::Handle<(vk::HandleType)20>::Handle(&local_768,0);
    pvVar21 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
              ::operator[](&(this->super_SparseShaderIntrinsicsInstanceBase).imageResidencyViews,
                           (ulong)gridSize.m_data[1]);
    pRVar22 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator*
                         (pvVar21)->super_RefBase<vk::Handle<(vk::HandleType)13>_>;
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*(pRVar22);
    descriptorUpdateBuilder.m_copies.
    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pHVar23->m_internal;
    ::vk::makeDescriptorImageInfo
              ((VkDescriptorImageInfo *)local_760,local_768,
               (VkImageView)
               descriptorUpdateBuilder.m_copies.
               super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,VK_IMAGE_LAYOUT_GENERAL);
    ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)local_7b8);
    local_7c0.m_internal._0_4_ = mipLevelRange.baseArrayLayer;
    local_7c0.m_internal._4_4_ = mipLevelRange.layerCount;
    local_7c8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
    VVar3 = (*(this->super_SparseShaderIntrinsicsInstanceBase).super_SparseResourcesBaseInstance.
              super_TestInstance._vptr_TestInstance[7])();
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              ((DescriptorSetUpdateBuilder *)local_7b8,local_7c0,&local_7c8,VVar3,
               (VkDescriptorImageInfo *)local_660);
    local_7d0.m_internal._0_4_ = mipLevelRange.baseArrayLayer;
    local_7d0.m_internal._4_4_ = mipLevelRange.layerCount;
    local_7d8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              ((DescriptorSetUpdateBuilder *)local_7b8,local_7d0,&local_7d8,
               VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,(VkDescriptorImageInfo *)local_6e0);
    local_7e0.m_internal._0_4_ = mipLevelRange.baseArrayLayer;
    local_7e0.m_internal._4_4_ = mipLevelRange.layerCount;
    local_7e8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(2);
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              ((DescriptorSetUpdateBuilder *)local_7b8,local_7e0,&local_7e8,
               VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,(VkDescriptorImageInfo *)local_760);
    pVVar12 = SparseResourcesBaseInstance::getDevice((SparseResourcesBaseInstance *)this);
    ::vk::DescriptorSetUpdateBuilder::update((DescriptorSetUpdateBuilder *)local_7b8,vk,pVVar12);
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_128);
    (*vk->_vptr_DeviceInterface[0x56])
              (vk,commandBuffer,1,pHVar14->m_internal,0,1,&mipLevelRange.baseArrayLayer,0,0);
    uVar5 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar6 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_508);
    uVar7 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar8 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_508);
    uVar5 = (uVar5 / uVar6 + 1) - (uint)(uVar7 % uVar8 == 0);
    uVar6 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar7 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_508);
    uVar8 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar9 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_508);
    uVar6 = (uVar6 / uVar7 + 1) - (uint)(uVar8 % uVar9 == 0);
    uVar7 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar8 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_508);
    uVar9 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)(workGroupSize.m_data + 1));
    uVar10 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_508);
    uVar7 = (uVar7 / uVar8 + 1) - (uint)(uVar9 % uVar10 == 0);
    tcu::Vector<unsigned_int,_3>::Vector
              ((Vector<unsigned_int,_3> *)
               &imageOutputTransferSrcBarriers[1].subresourceRange.layerCount,0xffff,0xffff,0xffff);
    uVar8 = tcu::Vector<unsigned_int,_3>::x
                      ((Vector<unsigned_int,_3> *)
                       &imageOutputTransferSrcBarriers[1].subresourceRange.layerCount);
    if (uVar8 < uVar5) break;
    uVar8 = tcu::Vector<unsigned_int,_3>::y
                      ((Vector<unsigned_int,_3> *)
                       &imageOutputTransferSrcBarriers[1].subresourceRange.layerCount);
    if (uVar8 < uVar6) break;
    uVar8 = tcu::Vector<unsigned_int,_3>::z
                      ((Vector<unsigned_int,_3> *)
                       &imageOutputTransferSrcBarriers[1].subresourceRange.layerCount);
    if (uVar8 < uVar7) break;
    (*vk->_vptr_DeviceInterface[0x5d])(vk,commandBuffer,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
    ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
              ((DescriptorSetUpdateBuilder *)local_7b8);
    gridSize.m_data[1] = gridSize.m_data[1] + 1;
  }
  pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar11,"Image size exceeds compute invocations limit",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesShaderIntrinsicsStorage.cpp"
             ,0x1ec);
  __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void SparseShaderIntrinsicsInstanceStorage::recordCommands (const VkCommandBuffer		commandBuffer,
															const VkImageCreateInfo&	imageSparseInfo,
															const VkImage				imageSparse,
															const VkImage				imageTexels,
															const VkImage				imageResidency)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const DeviceInterface&		deviceInterface = getDeviceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	// Check if device supports image format for storage image
	if (!checkImageFormatFeatureSupport(instance, physicalDevice, imageSparseInfo.format, VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
		TCU_THROW(NotSupportedError, "Device does not support image format for storage image");

	// Make sure device supports VK_FORMAT_R32_UINT format for storage image
	if (!checkImageFormatFeatureSupport(instance, physicalDevice, mapTextureFormat(m_residencyFormat), VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT))
		TCU_THROW(TestError, "Device does not support VK_FORMAT_R32_UINT format for storage image");

	pipelines.resize(imageSparseInfo.mipLevels);
	descriptorSets.resize(imageSparseInfo.mipLevels);
	imageSparseViews.resize(imageSparseInfo.mipLevels);
	imageTexelsViews.resize(imageSparseInfo.mipLevels);
	imageResidencyViews.resize(imageSparseInfo.mipLevels);

	// Create descriptor set layout
	DescriptorSetLayoutBuilder descriptorLayerBuilder;

	descriptorLayerBuilder.addSingleBinding(imageSparseDescType(), VK_SHADER_STAGE_COMPUTE_BIT);
	descriptorLayerBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT);
	descriptorLayerBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(descriptorLayerBuilder.build(deviceInterface, getDevice()));

	// Create pipeline layout
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(deviceInterface, getDevice(), *descriptorSetLayout));

	// Create descriptor pool
	DescriptorPoolBuilder descriptorPoolBuilder;

	descriptorPoolBuilder.addType(imageSparseDescType(), imageSparseInfo.mipLevels);
	descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, imageSparseInfo.mipLevels);
	descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, imageSparseInfo.mipLevels);

	descriptorPool = descriptorPoolBuilder.build(deviceInterface, getDevice(), VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, imageSparseInfo.mipLevels);

	const VkImageSubresourceRange fullImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, imageSparseInfo.mipLevels, 0u, imageSparseInfo.arrayLayers);

	{
		VkImageMemoryBarrier imageShaderAccessBarriers[3];

		imageShaderAccessBarriers[0] = makeImageMemoryBarrier
		(
			VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_ACCESS_SHADER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			VK_IMAGE_LAYOUT_GENERAL,
			imageSparse,
			fullImageSubresourceRange
		);

		imageShaderAccessBarriers[1] = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			imageTexels,
			fullImageSubresourceRange
		);

		imageShaderAccessBarriers[2] = makeImageMemoryBarrier
		(
			0u,
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED,
			VK_IMAGE_LAYOUT_GENERAL,
			imageResidency,
			fullImageSubresourceRange
		);

		deviceInterface.cmdPipelineBarrier(commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 3u, imageShaderAccessBarriers);
	}

	const VkSpecializationMapEntry specializationMapEntries[6] =
	{
		{ 1u, 0u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.x
		{ 2u, 1u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.y
		{ 3u, 2u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // GridSize.z
		{ 4u, 3u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.x
		{ 5u, 4u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.y
		{ 6u, 5u * (deUint32)sizeof(deUint32), sizeof(deUint32) }, // WorkGroupSize.z
	};

	Unique<VkShaderModule> shaderModule(createShaderModule(deviceInterface, getDevice(), m_context.getBinaryCollection().get("compute"), 0u));

	for (deUint32 mipLevelNdx = 0u; mipLevelNdx < imageSparseInfo.mipLevels; ++mipLevelNdx)
	{
		const tcu::UVec3  gridSize				= getShaderGridSize(m_imageType, m_imageSize, mipLevelNdx);
		const tcu::UVec3  workGroupSize			= computeWorkGroupSize(gridSize);
		const tcu::UVec3 specializationData[2]	= { gridSize, workGroupSize };

		const VkSpecializationInfo specializationInfo =
		{
			(deUint32)DE_LENGTH_OF_ARRAY(specializationMapEntries),	// mapEntryCount
			specializationMapEntries,								// pMapEntries
			sizeof(specializationData),								// dataSize
			specializationData,										// pData
		};

		// Create and bind compute pipeline
		pipelines[mipLevelNdx] = makeVkSharedPtr(makeComputePipeline(deviceInterface, getDevice(), *pipelineLayout, *shaderModule, &specializationInfo));
		const VkPipeline computePipeline = **pipelines[mipLevelNdx];

		deviceInterface.cmdBindPipeline(commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, computePipeline);

		// Create descriptor set
		descriptorSets[mipLevelNdx] = makeVkSharedPtr(makeDescriptorSet(deviceInterface, getDevice(), *descriptorPool, *descriptorSetLayout));
		const VkDescriptorSet descriptorSet = **descriptorSets[mipLevelNdx];

		// Bind resources
		const VkImageSubresourceRange mipLevelRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, mipLevelNdx, 1u, 0u, imageSparseInfo.arrayLayers);

		imageSparseViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageSparse, mapImageViewType(m_imageType), imageSparseInfo.format, mipLevelRange));
		const VkDescriptorImageInfo imageSparseDescInfo = makeDescriptorImageInfo(DE_NULL, **imageSparseViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		imageTexelsViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageTexels, mapImageViewType(m_imageType), imageSparseInfo.format, mipLevelRange));
		const VkDescriptorImageInfo imageTexelsDescInfo = makeDescriptorImageInfo(DE_NULL, **imageTexelsViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		imageResidencyViews[mipLevelNdx] = makeVkSharedPtr(makeImageView(deviceInterface, getDevice(), imageResidency, mapImageViewType(m_imageType), mapTextureFormat(m_residencyFormat), mipLevelRange));
		const VkDescriptorImageInfo imageResidencyDescInfo = makeDescriptorImageInfo(DE_NULL, **imageResidencyViews[mipLevelNdx], VK_IMAGE_LAYOUT_GENERAL);

		DescriptorSetUpdateBuilder descriptorUpdateBuilder;
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_SPARSE), imageSparseDescType(), &imageSparseDescInfo);
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_TEXELS), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageTexelsDescInfo);
		descriptorUpdateBuilder.writeSingle(descriptorSet, DescriptorSetUpdateBuilder::Location::binding(BINDING_IMAGE_RESIDENCY), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageResidencyDescInfo);

		descriptorUpdateBuilder.update(deviceInterface, getDevice());

		deviceInterface.cmdBindDescriptorSets(commandBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);

		const deUint32		xWorkGroupCount = gridSize.x() / workGroupSize.x() + (gridSize.x() % workGroupSize.x() ? 1u : 0u);
		const deUint32		yWorkGroupCount = gridSize.y() / workGroupSize.y() + (gridSize.y() % workGroupSize.y() ? 1u : 0u);
		const deUint32		zWorkGroupCount = gridSize.z() / workGroupSize.z() + (gridSize.z() % workGroupSize.z() ? 1u : 0u);
		const tcu::UVec3	maxWorkGroupCount = tcu::UVec3(65535u, 65535u, 65535u);

		if (maxWorkGroupCount.x() < xWorkGroupCount ||
			maxWorkGroupCount.y() < yWorkGroupCount ||
			maxWorkGroupCount.z() < zWorkGroupCount)
		{
			TCU_THROW(NotSupportedError, "Image size exceeds compute invocations limit");
		}

		deviceInterface.cmdDispatch(commandBuffer, xWorkGroupCount, yWorkGroupCount, zWorkGroupCount);
	}

	{
		VkImageMemoryBarrier imageOutputTransferSrcBarriers[2];

		imageOutputTransferSrcBarriers[0] = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			imageTexels,
			fullImageSubresourceRange
		);

		imageOutputTransferSrcBarriers[1] = makeImageMemoryBarrier
		(
			VK_ACCESS_SHADER_WRITE_BIT,
			VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL,
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			imageResidency,
			fullImageSubresourceRange
		);

		deviceInterface.cmdPipelineBarrier(commandBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 2u, imageOutputTransferSrcBarriers);
	}
}